

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O2

void BaseSocket::SetTrafficDebugCallback
               (function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)> *fnCbTrafficDbg)

{
  function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)> fStack_28;
  
  std::function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)>::function
            (&fStack_28,fnCbTrafficDbg);
  BaseSocketImpl::SetTrafficDebugCallback(&fStack_28);
  std::_Function_base::~_Function_base(&fStack_28.super__Function_base);
  return;
}

Assistant:

void BaseSocket::SetTrafficDebugCallback(std::function<void(const uint16_t, const char*, size_t, bool)> fnCbTrafficDbg)
{
    BaseSocketImpl::SetTrafficDebugCallback(fnCbTrafficDbg);
}